

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O0

float32 __thiscall rw::Matrix::identityError(Matrix *this)

{
  float32 fVar1;
  float32 fVar2;
  float32 fVar3;
  float32 fVar4;
  undefined1 local_34 [8];
  V3d a;
  V3d u;
  V3d r;
  Matrix *this_local;
  
  u.y = (float32)((float)(this->right).x - 1.0);
  u.z = (this->right).y;
  a.y = (this->up).x;
  a.z = (float32)((float)(this->up).y - 1.0);
  u.x = (this->up).z;
  local_34._0_4_ = (this->at).x;
  local_34._4_4_ = (this->at).y;
  a.x = (float32)((float)(this->at).z - 1.0);
  fVar1 = dot((V3d *)&u.y,(V3d *)&u.y);
  fVar2 = dot((V3d *)&a.y,(V3d *)&a.y);
  fVar3 = dot((V3d *)local_34,(V3d *)local_34);
  fVar4 = dot(&this->pos,&this->pos);
  return (float32)((float)fVar1 + (float)fVar2 + (float)fVar3 + (float)fVar4);
}

Assistant:

float32
Matrix::identityError(void)
{
	V3d r = { right.x-1.0f, right.y, right.z };
	V3d u = { up.x, up.y-1.0f, up.z };
	V3d a = { at.x, at.y, at.z-1.0f };
	return dot(r,r) + dot(u,u) + dot(a,a) + dot(pos,pos);
}